

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O1

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this,path *name,
          dimension2d<unsigned_int> *size,E_TEXTURE_TYPE type,ECOLOR_FORMAT format,
          COpenGLDriver *driver)

{
  E_TEXTURE_TYPE EVar1;
  uint uVar2;
  GLenum GVar3;
  GLenum GVar4;
  dimension2d<unsigned_int> dVar5;
  long lVar6;
  ITexture *texture;
  bool bVar7;
  E_DRIVER_TYPE EVar8;
  ECOLOR_FORMAT format_00;
  u32 uVar9;
  GLint GVar10;
  GLenum GVar11;
  uint uVar12;
  COpenGLDriver *converter;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  
  *(undefined8 *)&this->field_0xf8 = 0;
  *(undefined4 *)&this->field_0x100 = 1;
  (this->super_ITexture)._vptr_ITexture = (_func_int **)0x267f68;
  *(undefined8 *)&this->field_0xf0 = 0x267fa8;
  converter = driver;
  irr::io::SNamedPath::SNamedPath(&(this->super_ITexture).NamedPath,name);
  (this->super_ITexture).OriginalSize.Width = 0;
  (this->super_ITexture).OriginalSize.Height = 0;
  (this->super_ITexture).Size.Width = 0;
  (this->super_ITexture).Size.Height = 0;
  (this->super_ITexture).DriverType = EDT_NULL;
  (this->super_ITexture).OriginalColorFormat = ECF_UNKNOWN;
  (this->super_ITexture).ColorFormat = ECF_UNKNOWN;
  (this->super_ITexture).Pitch = 0;
  (this->super_ITexture).HasMipMaps = false;
  (this->super_ITexture).IsRenderTarget = false;
  (this->super_ITexture).Source = ETS_UNKNOWN;
  (this->super_ITexture).Type = type;
  (this->super_ITexture)._vptr_ITexture = (_func_int **)0x267ee0;
  *(undefined8 *)&this->field_0xf0 = 0x267f20;
  *(COpenGLDriver **)&(this->super_ITexture).field_0x78 = driver;
  *(undefined4 *)&(this->super_ITexture).field_0x80 = 0xde1;
  *(undefined4 *)&(this->super_ITexture).field_0x84 = 0;
  *(undefined4 *)&(this->super_ITexture).field_0x88 = 0x1908;
  *(undefined4 *)&(this->super_ITexture).field_0x8c = 0x1908;
  this->PixelType = 0x1401;
  this->Converter = (_func_void_void_ptr_s32_void_ptr *)0x0;
  this->LockReadOnly = false;
  this->LockImage = (IImage *)0x0;
  this->LockLayer = 0;
  this->KeepImage = false;
  (this->Images).m_data.
  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Images).m_data.
  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Images).m_data.
  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Images).is_sorted = true;
  this->MipLevelStored = '\0';
  this->LegacyAutoGenerateMipMaps = false;
  (this->StatesCache).AnisotropicFilter = '\0';
  (this->StatesCache).WrapU = '\0';
  (this->StatesCache).WrapV = '\0';
  (this->StatesCache).WrapW = '\0';
  (this->StatesCache).LODBias = '\0';
  (this->StatesCache).MinFilter = ETMINF_NEAREST_MIPMAP_NEAREST;
  (this->StatesCache).MagFilter = ETMAGF_NEAREST;
  (this->StatesCache).MipMapStatus = false;
  (this->StatesCache).IsCached = false;
  EVar8 = (*(driver->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x54])(driver);
  (this->super_ITexture).DriverType = EVar8;
  EVar1 = (this->super_ITexture).Type;
  uVar13 = 0xde1;
  if (EVar1 != ETT_2D) {
    if (EVar1 == ETT_CUBEMAP) {
      uVar13 = 0x8513;
    }
    else {
      os::Printer::log((Printer *)"COpenGLCoreTexture::TextureTypeIrrToGL unknown texture type",
                       (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    }
  }
  *(undefined4 *)&(this->super_ITexture).field_0x80 = uVar13;
  (this->super_ITexture).HasMipMaps = false;
  (this->super_ITexture).IsRenderTarget = true;
  (this->super_ITexture).OriginalColorFormat = format;
  if (format == ECF_UNKNOWN) {
    format_00 = (**(code **)(**(long **)&(this->super_ITexture).field_0x78 + 0x1d0))();
    format = getBestColorFormat(this,format_00);
  }
  (this->super_ITexture).ColorFormat = format;
  dVar5 = *size;
  (this->super_ITexture).OriginalSize = dVar5;
  (this->super_ITexture).Size = dVar5;
  uVar9 = IImage::getBitsPerPixelFromFormat(format);
  (this->super_ITexture).Pitch = uVar9 * dVar5.Width >> 3;
  bVar7 = COpenGLDriver::getColorFormatParameters
                    (*(COpenGLDriver **)&(this->super_ITexture).field_0x78,
                     (this->super_ITexture).ColorFormat,(GLint *)&(this->super_ITexture).field_0x88,
                     (GLenum *)&(this->super_ITexture).field_0x8c,&this->PixelType,
                     (_func_void_void_ptr_s32_void_ptr **)converter);
  if (!bVar7) {
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    return;
  }
  (*GL.GenTextures)(1,(GLuint *)&(this->super_ITexture).field_0x84);
  lVar6 = *(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0xbe8);
  texture = *(ITexture **)(lVar6 + 0x20);
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::STextureCache::set((STextureCache *)(lVar6 + 0x10),0,&this->super_ITexture,EST_ACTIVE_ALWAYS);
  (*GL.TexParameteri)(*(GLenum *)&(this->super_ITexture).field_0x80,0x2801,0x2600);
  (*GL.TexParameteri)(*(GLenum *)&(this->super_ITexture).field_0x80,0x2800,0x2600);
  (*GL.TexParameteri)(*(GLenum *)&(this->super_ITexture).field_0x80,0x2802,0x812f);
  (*GL.TexParameteri)(*(GLenum *)&(this->super_ITexture).field_0x80,0x2803,0x812f);
  (*GL.TexParameteri)(*(GLenum *)&(this->super_ITexture).field_0x80,0x8072,0x812f);
  (this->StatesCache).WrapU = '\x02';
  (this->StatesCache).WrapV = '\x02';
  (this->StatesCache).WrapW = '\x02';
  EVar1 = (this->super_ITexture).Type;
  if (EVar1 == ETT_CUBEMAP) {
    (*GL.TexImage2D)(0x8515,0,*(GLint *)&(this->super_ITexture).field_0x88,
                     (this->super_ITexture).Size.Width,(this->super_ITexture).Size.Height,0,
                     *(GLenum *)&(this->super_ITexture).field_0x8c,this->PixelType,(void *)0x0);
    (*GL.TexImage2D)(0x8516,0,*(GLint *)&(this->super_ITexture).field_0x88,
                     (this->super_ITexture).Size.Width,(this->super_ITexture).Size.Height,0,
                     *(GLenum *)&(this->super_ITexture).field_0x8c,this->PixelType,(void *)0x0);
    (*GL.TexImage2D)(0x8517,0,*(GLint *)&(this->super_ITexture).field_0x88,
                     (this->super_ITexture).Size.Width,(this->super_ITexture).Size.Height,0,
                     *(GLenum *)&(this->super_ITexture).field_0x8c,this->PixelType,(void *)0x0);
    (*GL.TexImage2D)(0x8518,0,*(GLint *)&(this->super_ITexture).field_0x88,
                     (this->super_ITexture).Size.Width,(this->super_ITexture).Size.Height,0,
                     *(GLenum *)&(this->super_ITexture).field_0x8c,this->PixelType,(void *)0x0);
    (*GL.TexImage2D)(0x8519,0,*(GLint *)&(this->super_ITexture).field_0x88,
                     (this->super_ITexture).Size.Width,(this->super_ITexture).Size.Height,0,
                     *(GLenum *)&(this->super_ITexture).field_0x8c,this->PixelType,(void *)0x0);
    GVar10 = *(GLint *)&(this->super_ITexture).field_0x88;
    uVar2 = (this->super_ITexture).Size.Width;
    uVar12 = (this->super_ITexture).Size.Height;
    GVar3 = *(GLenum *)&(this->super_ITexture).field_0x8c;
    GVar4 = this->PixelType;
    GVar11 = 0x851a;
  }
  else {
    if (EVar1 != ETT_2D) goto LAB_001e9e4d;
    GVar10 = *(GLint *)&(this->super_ITexture).field_0x88;
    uVar2 = (this->super_ITexture).Size.Width;
    uVar12 = (this->super_ITexture).Size.Height;
    GVar3 = *(GLenum *)&(this->super_ITexture).field_0x8c;
    GVar4 = this->PixelType;
    GVar11 = 0xde1;
  }
  (*GL.TexImage2D)(GVar11,0,GVar10,uVar2,uVar12,0,GVar3,GVar4,(void *)0x0);
LAB_001e9e4d:
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::STextureCache::set
            ((STextureCache *)
             (*(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0xbe8) + 0x10),0,texture,
             EST_ACTIVE_ALWAYS);
  return;
}

Assistant:

COpenGLCoreTexture(const io::path &name, const core::dimension2d<u32> &size, E_TEXTURE_TYPE type, ECOLOR_FORMAT format, TOpenGLDriver *driver) :
			ITexture(name, type),
			Driver(driver), TextureType(GL_TEXTURE_2D),
			TextureName(0), InternalFormat(GL_RGBA), PixelFormat(GL_RGBA), PixelType(GL_UNSIGNED_BYTE), Converter(0), LockReadOnly(false), LockImage(0), LockLayer(0), KeepImage(false),
			MipLevelStored(0), LegacyAutoGenerateMipMaps(false)
	{
		DriverType = Driver->getDriverType();
		TextureType = TextureTypeIrrToGL(Type);
		HasMipMaps = false;
		IsRenderTarget = true;

		OriginalColorFormat = format;

		if (ECF_UNKNOWN == OriginalColorFormat)
			ColorFormat = getBestColorFormat(Driver->getColorFormat());
		else
			ColorFormat = OriginalColorFormat;

		OriginalSize = size;
		Size = OriginalSize;

		Pitch = Size.Width * IImage::getBitsPerPixelFromFormat(ColorFormat) / 8;

		if (!Driver->getColorFormatParameters(ColorFormat, InternalFormat, PixelFormat, PixelType, &Converter)) {
			os::Printer::log("COpenGLCoreTexture: Color format is not supported", ColorFormatNames[ColorFormat < ECF_UNKNOWN ? ColorFormat : ECF_UNKNOWN], ELL_ERROR);
			return;
		}

		GL.GenTextures(1, &TextureName);

		const COpenGLCoreTexture *prevTexture = Driver->getCacheHandler()->getTextureCache().get(0);
		Driver->getCacheHandler()->getTextureCache().set(0, this);

		GL.TexParameteri(TextureType, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GL.TexParameteri(TextureType, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GL.TexParameteri(TextureType, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		GL.TexParameteri(TextureType, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

#if defined(GL_VERSION_1_2)
		GL.TexParameteri(TextureType, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
#endif

		StatesCache.WrapU = ETC_CLAMP_TO_EDGE;
		StatesCache.WrapV = ETC_CLAMP_TO_EDGE;
		StatesCache.WrapW = ETC_CLAMP_TO_EDGE;

		switch (Type) {
		case ETT_2D:
			GL.TexImage2D(GL_TEXTURE_2D, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			break;
		case ETT_CUBEMAP:
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			break;
		}

		Driver->getCacheHandler()->getTextureCache().set(0, prevTexture);
		if (Driver->testGLError(__LINE__)) {
			char msg[256];
			snprintf_irr(msg, 256, "COpenGLCoreTexture: InternalFormat:0x%04x PixelFormat:0x%04x", (int)InternalFormat, (int)PixelFormat);
			os::Printer::log(msg, ELL_ERROR);
		}
	}